

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

void __thiscall Cmd::editMovePrevWord(Cmd *this,State *state)

{
  ulong uVar1;
  size_type sVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  string_view str;
  string sStack_98;
  basic_string_view<char,_std::char_traits<char>_> bStack_78;
  char acStack_68 [64];
  
  sVar4 = state->pos;
  while ((sVar4 = sVar4 - 1, sVar4 != 0xffffffffffffffff &&
         ((state->buf)._M_dataplus._M_p[sVar4] == ' '))) {
    state->pos = sVar4;
  }
  for (; (sVar4 != 0xffffffffffffffff && ((state->buf)._M_dataplus._M_p[sVar4] != ' '));
      sVar4 = sVar4 - 1) {
    state->pos = sVar4;
  }
  if (this->multiline_mode == true) {
    refreshMultiLine(this,state);
    return;
  }
  sVar2 = (this->prompt)._M_string_length;
  sStack_98._M_dataplus._M_p = (pointer)&sStack_98.field_2;
  sStack_98._M_string_length = 0;
  sStack_98.field_2._M_local_buf[0] = '\0';
  uVar3 = state->cols;
  uVar1 = state->pos + sVar2;
  uVar6 = uVar3 - 1;
  if (uVar1 < uVar3 - 1) {
    uVar6 = uVar1;
  }
  uVar5 = ((state->buf)._M_string_length + uVar6) - state->pos;
  bStack_78._M_str = (state->buf)._M_dataplus._M_p + (uVar1 - uVar6);
  if (uVar3 < uVar5) {
    uVar5 = uVar3;
  }
  bStack_78._M_len = uVar5 - sVar2;
  std::__cxx11::string::append((char *)&sStack_98);
  std::__cxx11::string::append((string *)&sStack_98);
  if (state->mask_mode == true) {
    std::__cxx11::string::append((ulong)&sStack_98,(char)(uVar5 - sVar2));
  }
  else {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&sStack_98,&bStack_78);
  }
  refreshShowHints(this,&sStack_98,state,(int)sVar2);
  std::__cxx11::string::append((char *)&sStack_98);
  snprintf(acStack_68,0x40,"\r\x1b[%dC",uVar6 & 0xffffffff);
  std::__cxx11::string::append((char *)&sStack_98);
  str._M_str = sStack_98._M_dataplus._M_p;
  str._M_len = sStack_98._M_string_length;
  write_string(this,str);
  std::__cxx11::string::~string((string *)&sStack_98);
  return;
}

Assistant:

void editMovePrevWord(State *state) {
		while (state->pos > 0 && state->buf[state->pos - 1] == ' ')
			state->pos--;

		while (state->pos > 0 && state->buf[state->pos - 1] != ' ')
			state->pos--;

		refreshLine(state);
	}